

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.cpp
# Opt level: O2

Vector3 * __thiscall
Vector3::refracted(Vector3 *__return_storage_ptr__,Vector3 *this,Vector3 *N,double n,
                  bool *isRefracted)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  dVar4 = N->x;
  dVar5 = N->y;
  dVar1 = N->z;
  if (1e-05 < ABS(SQRT(dVar1 * dVar1 + dVar4 * dVar4 + dVar5 * dVar5) + -1.0)) {
    __assert_fail("!sign(N.len() - 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Vector3.cpp"
                  ,0x93,"Vector3 Vector3::refracted(const Vector3 &, double, bool &) const");
  }
  auVar6._0_8_ = this->x;
  auVar6._8_8_ = this->y;
  dVar2 = this->z;
  if (ABS(SQRT(dVar2 * dVar2 +
               (double)auVar6._0_8_ * (double)auVar6._0_8_ +
               (double)auVar6._8_8_ * (double)auVar6._8_8_) + -1.0) <= 1e-05) {
    dVar5 = (dVar4 * -(double)auVar6._0_8_ - dVar5 * (double)auVar6._8_8_) - dVar1 * dVar2;
    dVar4 = ((1.0 - dVar5 * dVar5) / n) / n;
    *isRefracted = false;
    if (dVar4 <= 1.0) {
      dVar4 = 1.0 - dVar4;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      *isRefracted = true;
      auVar3._8_8_ = n;
      auVar3._0_8_ = n;
      auVar6 = divpd(auVar6,auVar3);
      dVar4 = dVar4 - dVar5 / n;
      dVar5 = N->z;
      dVar1 = N->y;
      __return_storage_ptr__->x = auVar6._0_8_ - dVar4 * N->x;
      __return_storage_ptr__->y = auVar6._8_8_ - dVar4 * dVar1;
      __return_storage_ptr__->z = dVar2 / n - dVar5 * dVar4;
    }
    else {
      reflected(__return_storage_ptr__,this,N);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!sign(len() - 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Vector3.cpp"
                ,0x94,"Vector3 Vector3::refracted(const Vector3 &, double, bool &) const");
}

Assistant:

Vector3 Vector3::refracted(const Vector3 &N, double n, bool &isRefracted) const{
#ifdef DEBUG
    assert(!sign(N.len() - 1));
    assert(!sign(len() - 1));
#endif
    Vector3 V = -*this;
    double cos1 = N.dot(V), sin22 = (1 - cos1 * cos1)/n/n;
    isRefracted = 0;
    if (sin22 > 1) return reflected(N);
    double cos2 = sqrt(1 - sin22);
    isRefracted = 1;
    return -V/n - (cos2 - cos1/n) * N;
}